

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

int64_t hdr_count_at_value(hdr_histogram *h,int64_t value)

{
  int32_t index;
  int64_t iVar1;
  
  index = counts_index_for(h,value);
  iVar1 = counts_get_normalised(h,index);
  return iVar1;
}

Assistant:

int64_t hdr_count_at_value(const struct hdr_histogram* h, int64_t value)
{
    return counts_get_normalised(h, counts_index_for(h, value));
}